

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

VarType * deqp::gles3::Functional::generateRandomType
                    (VarType *__return_storage_ptr__,int maxDepth,int *curStructIdx,
                    vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    *structTypesDst,Random *rnd)

{
  bool bVar1;
  int iVar2;
  StructType *pSVar3;
  char *pcVar4;
  float fVar5;
  bool local_13a;
  VarType local_138;
  Precision local_11c;
  DataType local_118;
  Precision precision;
  DataType basicType;
  VarType local_f8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_9c;
  undefined1 local_95;
  int i;
  int local_84;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StructType *local_40;
  StructType *structType;
  int numMembers;
  bool isArray;
  bool isStruct;
  Random *rnd_local;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *structTypesDst_local;
  int *curStructIdx_local;
  VarType *pVStack_10;
  int maxDepth_local;
  
  local_13a = false;
  _numMembers = rnd;
  rnd_local = (Random *)structTypesDst;
  structTypesDst_local =
       (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *)curStructIdx;
  curStructIdx_local._4_4_ = maxDepth;
  pVStack_10 = __return_storage_ptr__;
  if (0 < maxDepth) {
    fVar5 = de::Random::getFloat(rnd);
    local_13a = fVar5 < 0.2;
  }
  structType._7_1_ = local_13a;
  fVar5 = de::Random::getFloat(_numMembers);
  structType._6_1_ = fVar5 < 0.3;
  if ((structType._7_1_ & 1) == 0) {
    iVar2 = de::Random::getInt(_numMembers,0,0x1a);
    local_118 = *(DataType *)(s_testDataTypes + (long)iVar2 * 4);
    bVar1 = glu::isDataTypeBoolOrBVec(local_118);
    local_11c = PRECISION_MEDIUMP;
    if (bVar1) {
      local_11c = PRECISION_LAST;
    }
    if ((structType._6_1_ & 1) == 0) {
      glu::VarType::VarType(__return_storage_ptr__,local_118,local_11c);
    }
    else {
      glu::VarType::VarType(&local_138,local_118,local_11c);
      iVar2 = de::Random::getInt(_numMembers,1,5);
      glu::VarType::VarType(__return_storage_ptr__,&local_138,iVar2);
      glu::VarType::~VarType(&local_138);
    }
  }
  else {
    structType._0_4_ = de::Random::getInt(_numMembers,1,5);
    pSVar3 = (StructType *)operator_new(0x38);
    local_95 = 1;
    local_84 = *(int *)&(structTypesDst_local->
                        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    *(int *)&(structTypesDst_local->
             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
             _M_impl.super__Vector_impl_data._M_start = local_84 + 1;
    de::toString<int>(&local_80,&local_84);
    std::operator+(&local_60,"structType",&local_80);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    glu::StructType::StructType(pSVar3,pcVar4);
    local_95 = 0;
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    local_40 = pSVar3;
    for (local_9c = 0; pSVar3 = local_40, local_9c < (int)structType; local_9c = local_9c + 1) {
      de::toString<int>(&local_e0,&local_9c);
      std::operator+(&local_c0,"m",&local_e0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      generateRandomType(&local_f8,curStructIdx_local._4_4_ + -1,(int *)structTypesDst_local,
                         (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                          *)rnd_local,_numMembers);
      glu::StructType::addMember(pSVar3,pcVar4,&local_f8);
      glu::VarType::~VarType(&local_f8);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
              ((vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *)
               rnd_local,&local_40);
    precision._3_1_ = PRECISION_LOWP >> 0x18;
    if ((structType._6_1_ & 1) == 0) {
      glu::VarType::VarType(__return_storage_ptr__,local_40);
    }
    else {
      glu::VarType::VarType((VarType *)&basicType,local_40);
      precision._3_1_ = 1;
      iVar2 = de::Random::getInt(_numMembers,1,5);
      glu::VarType::VarType(__return_storage_ptr__,(VarType *)&basicType,iVar2);
    }
    if ((precision._3_1_ & 1) != PRECISION_LOWP >> 0x18) {
      glu::VarType::~VarType((VarType *)&basicType);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static glu::VarType generateRandomType (const int maxDepth, int& curStructIdx, vector<const StructType*>& structTypesDst, Random& rnd)
{
	const bool isStruct		= maxDepth > 0 && rnd.getFloat() < 0.2f;
	const bool isArray		= rnd.getFloat() < 0.3f;

	if (isStruct)
	{
		const int			numMembers = rnd.getInt(1, 5);
		StructType* const	structType = new StructType(("structType" + de::toString(curStructIdx++)).c_str());

		for (int i = 0; i < numMembers; i++)
			structType->addMember(("m" + de::toString(i)).c_str(), generateRandomType(maxDepth-1, curStructIdx, structTypesDst, rnd));

		structTypesDst.push_back(structType);
		return isArray ? glu::VarType(glu::VarType(structType), rnd.getInt(1, 5)) : glu::VarType(structType);
	}
	else
	{
		const glu::DataType		basicType = (glu::DataType)s_testDataTypes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes)-1)];
		const glu::Precision	precision = glu::isDataTypeBoolOrBVec(basicType) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		return isArray ? glu::VarType(glu::VarType(basicType, precision), rnd.getInt(1, 5)) : glu::VarType(basicType, precision);
	}
}